

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ofstream *this;
  ulong uVar4;
  unsigned_long ctr;
  ulong uVar5;
  ostream *os;
  user_options opt;
  ostringstream str;
  allocator_type local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong local_1e0;
  user_options local_1d8;
  vector<bool,_std::allocator<bool>_> local_1a8 [9];
  
  user_options::get(&local_1d8,argc,argv);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  if (iVar3 == 0) {
    this = (ofstream *)0x0;
    os = (ostream *)&std::cout;
  }
  else {
    this = (ofstream *)operator_new(0x200);
    std::ofstream::ofstream(this,(string *)&local_1d8,_S_trunc|_S_out|_S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    os = (ostream *)this;
    if (cVar2 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Could not open ",0xf)
      ;
      local_208._M_string_length = CONCAT62(local_208._M_string_length._2_6_,0x22);
      local_208._M_dataplus._M_p = (pointer)&local_1d8;
      std::__detail::operator<<
                ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)&local_208);
      std::__cxx11::stringbuf::str();
      pstore::raise<std::errc,std::__cxx11::string>(no_such_file_or_directory,&local_208);
    }
  }
  if (local_1d8.maximum < 0x10000) {
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity = 0;
    local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_2_ = 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_208,(iterator)0x0,
               (unsigned_short *)local_1a8);
    local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT62(local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._2_6_,2);
    if (local_208._M_string_length == local_208.field_2._M_allocated_capacity) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
      _M_realloc_insert<unsigned_short>
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_208,
                 (iterator)local_208._M_string_length,(unsigned_short *)local_1a8);
    }
    else {
      *(unsigned_short *)local_208._M_string_length = 2;
      local_208._M_string_length = local_208._M_string_length + 2;
    }
    local_1e0 = CONCAT71(local_1e0._1_7_,1);
    std::vector<bool,_std::allocator<bool>_>::vector
              (local_1a8,local_1d8.maximum + 1 >> 1,(bool *)&local_1e0,&local_209);
    if (2 < local_1d8.maximum) {
      uVar5 = 3;
      do {
        if ((local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5 >> 7] >>
             ((uVar5 & 0xffffffff) >> 1 & 0x3f) & 1) != 0) {
          local_1e0 = CONCAT62(local_1e0._2_6_,(unsigned_short)uVar5);
          if (local_208._M_string_length == local_208.field_2._M_allocated_capacity) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_208,
                       (iterator)local_208._M_string_length,(unsigned_short *)&local_1e0);
          }
          else {
            *(unsigned_short *)local_208._M_string_length = (unsigned_short)uVar5;
            local_208._M_string_length = local_208._M_string_length + 2;
          }
          uVar4 = uVar5 * uVar5;
          if (uVar4 < local_1d8.maximum || uVar4 - local_1d8.maximum == 0) {
            do {
              bVar1 = (byte)((uVar4 & 0xffffffff) >> 1) & 0x3f;
              local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 7] =
                   local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 7] &
                   (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
              uVar4 = uVar4 + uVar5 * 2;
            } while (uVar4 <= local_1d8.maximum);
          }
        }
        uVar5 = uVar5 + 2;
      } while (uVar5 <= local_1d8.maximum);
    }
    if (local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    write_output<std::vector<unsigned_short,std::allocator<unsigned_short>>>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_208,
               local_1d8.endianness,os);
  }
  else if (local_1d8.maximum >> 0x20 == 0) {
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity = 0;
    local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,(iterator)0x0,
               (uint *)local_1a8);
    local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,2);
    if (local_208._M_string_length == local_208.field_2._M_allocated_capacity) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,
                 (iterator)local_208._M_string_length,(uint *)local_1a8);
    }
    else {
      *(uint *)local_208._M_string_length = 2;
      local_208._M_string_length = local_208._M_string_length + 4;
    }
    local_1e0 = CONCAT71(local_1e0._1_7_,1);
    std::vector<bool,_std::allocator<bool>_>::vector
              (local_1a8,local_1d8.maximum + 1 >> 1,(bool *)&local_1e0,&local_209);
    uVar5 = 3;
    do {
      if ((local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar5 >> 7] >> ((uVar5 & 0xffffffff) >> 1 & 0x3f)
          & 1) != 0) {
        local_1e0 = CONCAT44(local_1e0._4_4_,(uint)uVar5);
        if (local_208._M_string_length == local_208.field_2._M_allocated_capacity) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,
                     (iterator)local_208._M_string_length,(uint *)&local_1e0);
        }
        else {
          *(uint *)local_208._M_string_length = (uint)uVar5;
          local_208._M_string_length = local_208._M_string_length + 4;
        }
        uVar4 = uVar5 * uVar5;
        if (uVar4 < local_1d8.maximum || uVar4 - local_1d8.maximum == 0) {
          do {
            bVar1 = (byte)((uVar4 & 0xffffffff) >> 1) & 0x3f;
            local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p[uVar4 >> 7] =
                 local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 7] &
                 (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
            uVar4 = uVar4 + uVar5 * 2;
          } while (uVar4 <= local_1d8.maximum);
        }
      }
      uVar5 = uVar5 + 2;
    } while (uVar5 <= local_1d8.maximum);
    if (local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    write_output<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,
               local_1d8.endianness,os);
  }
  else {
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity = 0;
    local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,(iterator)0x0,
               (unsigned_long *)local_1a8);
    local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x2;
    if (local_208._M_string_length == local_208.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,
                 (iterator)local_208._M_string_length,(unsigned_long *)local_1a8);
    }
    else {
      *(unsigned_long *)local_208._M_string_length = 2;
      local_208._M_string_length = local_208._M_string_length + 8;
    }
    local_1e0 = CONCAT71(local_1e0._1_7_,1);
    std::vector<bool,_std::allocator<bool>_>::vector
              (local_1a8,local_1d8.maximum + 1 >> 1,(bool *)&local_1e0,&local_209);
    uVar5 = 3;
    do {
      if ((local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar5 >> 7] >> ((uVar5 & 0xffffffff) >> 1 & 0x3f)
          & 1) != 0) {
        local_1e0 = uVar5;
        if (local_208._M_string_length == local_208.field_2._M_allocated_capacity) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,
                     (iterator)local_208._M_string_length,&local_1e0);
        }
        else {
          *(ulong *)local_208._M_string_length = uVar5;
          local_208._M_string_length = local_208._M_string_length + 8;
        }
        uVar4 = uVar5 * uVar5;
        if (uVar4 < local_1d8.maximum || uVar4 - local_1d8.maximum == 0) {
          do {
            bVar1 = (byte)((uVar4 & 0xffffffff) >> 1) & 0x3f;
            local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p[uVar4 >> 7] =
                 local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4 >> 7] &
                 (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
            uVar4 = uVar4 + uVar5 * 2;
          } while (uVar4 <= local_1d8.maximum);
        }
      }
      uVar5 = uVar5 + 2;
    } while (uVar5 <= local_1d8.maximum);
    if (local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a8[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    write_output<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,
               local_1d8.endianness,os);
  }
  if (local_208._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_208._M_dataplus._M_p,
                    local_208.field_2._M_allocated_capacity - (long)local_208._M_dataplus._M_p);
  }
  if (this != (ofstream *)0x0) {
    (**(code **)(*(long *)this + 8))(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.output._M_dataplus._M_p != &local_1d8.output.field_2) {
    operator_delete(local_1d8.output._M_dataplus._M_p,
                    local_1d8.output.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        user_options const opt = user_options::get (argc, argv);

        file_opener const out{opt.output};
        if (opt.maximum <= std::numeric_limits<std::uint16_t>::max ()) {
            write_output (sieve<std::uint16_t> (opt.maximum), opt.endianness, out.get_stream ());
        } else if (opt.maximum <= std::numeric_limits<std::uint32_t>::max ()) {
            write_output (sieve<std::uint32_t> (opt.maximum), opt.endianness, out.get_stream ());
        } else {
            write_output (sieve<std::uint64_t> (opt.maximum), opt.endianness, out.get_stream ());
        }
    }